

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

double Logger::log(double __x)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  char *__s;
  uint in_EDI;
  double dVar4;
  string label;
  allocator<char> local_31;
  string local_30 [32];
  
  if (in_EDI < 4) {
    __s = &DAT_00245cf8 + *(int *)(&DAT_00245cf8 + (ulong)in_EDI * 4);
  }
  else {
    __s = "DETAIL";
    if (in_EDI == 4) {
      __s = "DEBUG";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>(local_30,__s,&local_31);
  if ((int)in_EDI < 3) {
    poVar3 = (ostream *)&std::cerr;
  }
  else {
    poVar3 = (ostream *)&std::cout;
  }
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,": ");
  dVar4 = (double)std::__cxx11::string::~string(local_30);
  return dVar4;
}

Assistant:

static std::ostream & log(Logger::Level::Type level)
    {
        std::string label = (level==Logger::Level::FATAL  ? "FATAL":
                            (level==Logger::Level::ERROR  ? "ERROR":
                            (level==Logger::Level::WARNING? "WARNING":
                            (level==Logger::Level::INFO   ? "INFO":
                            (level==Logger::Level::DEBUG  ? "DEBUG":"DETAIL")))));
        std::ostream * os = (level <= Logger::Level::WARNING ? &std::cerr : &std::cout);
        *os << std::left << std::setw(7) << label << ": ";
        return *os;
    }